

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O2

void __thiscall sigopcount_tests::GetTxSigOpCost::test_method(GetTxSigOpCost *this)

{
  long lVar1;
  ScriptError SVar2;
  CScript *pCVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  int64_t iVar5;
  undefined8 uVar6;
  size_type sVar7;
  uint32_t flags;
  uint32_t flags_00;
  uint32_t flags_01;
  uint32_t flags_02;
  uint32_t flags_03;
  uint32_t flags_04;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  span<const_std::byte,_18446744073709551615UL> b_08;
  span<const_std::byte,_18446744073709551615UL> b_09;
  iterator local_3e0;
  CScriptWitness scriptWitness_3;
  CKey key;
  CCoinsView coinsDummy;
  CMutableTransaction spendingTx;
  CMutableTransaction creationTx;
  CScriptWitness scriptWitness_2;
  CScript scriptSig_1;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_2f8;
  undefined1 local_2b0;
  CScript scriptSig;
  CScript scriptPubKey;
  CPubKey pubkey;
  CCoinsViewCache coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&creationTx);
  CMutableTransaction::CMutableTransaction(&spendingTx);
  coinsDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_01149610;
  CCoinsViewCache::CCoinsViewCache(&coins,&coinsDummy,false);
  GenerateRandomKey(SUB81(&key,0));
  CKey::GetPubKey(&pubkey,&key);
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = 0;
  local_2f8._0_8_ = 0;
  local_2f8._8_8_ = 0;
  pCVar3 = CScript::push_int64((CScript *)&local_2f8._M_first,1);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig,&pubkey)
  ;
  b._M_extent._M_extent_value =
       scriptSig.super_CScriptBase._union._8_8_ - scriptSig.super_CScriptBase._union._0_8_;
  b._M_ptr = (pointer)scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1,&pubkey);
  b_00._M_extent._M_extent_value =
       scriptSig_1.super_CScriptBase._union._8_8_ - scriptSig_1.super_CScriptBase._union._0_8_;
  b_00._M_ptr = (pointer)scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b_00);
  pCVar3 = CScript::push_int64(pCVar3,2);
  ppVar4 = &CScript::operator<<(pCVar3,OP_CHECKMULTISIGVERIFY)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&scriptPubKey.super_CScriptBase,ppVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = 0;
  local_2f8._0_8_ = 0;
  local_2f8._8_8_ = 0;
  pCVar3 = CScript::operator<<((CScript *)&local_2f8._M_first,OP_0);
  ppVar4 = &CScript::operator<<(pCVar3,OP_0)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&scriptSig.super_CScriptBase,ppVar4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
  local_2f8._0_8_ = 0;
  local_2f8._8_8_ = 0;
  local_2f8._16_8_ = 0;
  BuildTxs(&spendingTx,&coins,&creationTx,&scriptPubKey,&scriptSig,
           (CScriptWitness *)&local_2f8._M_first);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_2f8._M_first);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
  iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
  if (iVar5 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x89,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&creationTx);
  iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
  if (iVar5 != 0x50) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(creationTx), coins, flags) == MAX_PUBKEYS_PER_MULTISIG * WITNESS_SCALE_FACTOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x8c,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&creationTx);
  SVar2 = VerifyWithFlag((CTransaction *)&local_2f8._M_first,&spendingTx,flags);
  if (SVar2 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x8e,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = 0;
  local_2f8._0_8_ = 0;
  local_2f8._8_8_ = 0;
  pCVar3 = CScript::push_int64((CScript *)&local_2f8._M_first,1);
  ToByteVector<CPubKey>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig,&pubkey)
  ;
  b_01._M_extent._M_extent_value =
       scriptSig.super_CScriptBase._union._8_8_ - scriptSig.super_CScriptBase._union._0_8_;
  b_01._M_ptr = (pointer)scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b_01);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1,&pubkey);
  b_02._M_extent._M_extent_value =
       scriptSig_1.super_CScriptBase._union._8_8_ - scriptSig_1.super_CScriptBase._union._0_8_;
  b_02._M_ptr = (pointer)scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b_02);
  pCVar3 = CScript::push_int64(pCVar3,2);
  ppVar4 = &CScript::operator<<(pCVar3,OP_CHECKMULTISIGVERIFY)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&scriptPubKey.super_CScriptBase,ppVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
  ScriptHash::ScriptHash((ScriptHash *)&scriptSig_1,&scriptPubKey);
  local_2f8._16_4_ = scriptSig_1.super_CScriptBase._union._16_4_;
  local_2f8._0_8_ = scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
  local_2f8._8_8_ = scriptSig_1.super_CScriptBase._union._8_8_;
  local_2b0 = 3;
  GetScriptForDestination(&scriptSig,(CTxDestination *)&local_2f8._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_2f8._M_first);
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = 0;
  local_2f8._0_8_ = 0;
  local_2f8._8_8_ = 0;
  pCVar3 = CScript::operator<<((CScript *)&local_2f8._M_first,OP_0);
  pCVar3 = CScript::operator<<(pCVar3,OP_0);
  ToByteVector<CScript>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptWitness_2,&scriptPubKey
            );
  b_03._M_extent._M_extent_value =
       (long)scriptWitness_2.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)scriptWitness_2.stack.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  b_03._M_ptr = (pointer)scriptWitness_2.stack.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = &CScript::operator<<(pCVar3,b_03)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&scriptSig_1.super_CScriptBase,ppVar4)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptWitness_2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
  local_2f8._0_8_ = 0;
  local_2f8._8_8_ = 0;
  local_2f8._16_8_ = 0;
  BuildTxs(&spendingTx,&coins,&creationTx,&scriptSig,&scriptSig_1,
           (CScriptWitness *)&local_2f8._M_first);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_2f8._M_first);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
  iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
  if (iVar5 != 8) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2 * WITNESS_SCALE_FACTOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x98,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&creationTx);
  SVar2 = VerifyWithFlag((CTransaction *)&local_2f8._M_first,&spendingTx,flags_00);
  if (SVar2 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x99,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig_1.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&scriptSig,&pubkey);
  local_2f8._16_4_ = scriptSig.super_CScriptBase._union._16_4_;
  local_2f8._0_8_ = scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  local_2f8._8_8_ = scriptSig.super_CScriptBase._union._8_8_;
  local_2b0 = 5;
  GetScriptForDestination(&scriptPubKey,(CTxDestination *)&local_2f8._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_2f8._M_first);
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  scriptSig.super_CScriptBase._24_8_ = 0;
  scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  scriptSig_1.super_CScriptBase._union._16_8_ = 0;
  scriptSig_1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig_1.super_CScriptBase._union._8_8_ = 0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&scriptSig_1,(int *)&local_2f8);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&scriptSig_1,(int *)&local_2f8);
  BuildTxs(&spendingTx,&coins,&creationTx,&scriptPubKey,&scriptSig,(CScriptWitness *)&scriptSig_1);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
  iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
  if (iVar5 != 1) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa6,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
  iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,1);
  if (iVar5 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa8,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
  CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&creationTx);
  SVar2 = VerifyWithFlag((CTransaction *)&local_2f8._M_first,&spendingTx,flags_01);
  if (SVar2 == SCRIPT_ERR_EQUALVERIFY) {
    CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
    uVar6 = &scriptPubKey;
    if (0x1c < scriptPubKey.super_CScriptBase._size) {
      uVar6 = scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    }
    if ((((CScript *)uVar6)->super_CScriptBase)._union.direct[0] != '\0') {
      __assert_fail("scriptPubKey[0] == 0x00",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xac,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    (((CScript *)uVar6)->super_CScriptBase)._union.direct[0] = 'Q';
    BuildTxs(&spendingTx,&coins,&creationTx,&scriptPubKey,&scriptSig,(CScriptWitness *)&scriptSig_1)
    ;
    CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
    iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
    if (iVar5 != 0) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xaf,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
    uVar6 = &scriptPubKey;
    if (0x1c < scriptPubKey.super_CScriptBase._size) {
      uVar6 = scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    }
    (((CScript *)uVar6)->super_CScriptBase)._union.direct[0] = '\0';
    BuildTxs(&spendingTx,&coins,&creationTx,&scriptPubKey,&scriptSig,(CScriptWitness *)&scriptSig_1)
    ;
    COutPoint::SetNull(&(spendingTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start)->prevout);
    CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
    iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
    if (iVar5 != 0) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xb5,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&scriptSig_1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
    WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&scriptSig,&pubkey);
    local_2f8._16_4_ = scriptSig.super_CScriptBase._union._16_4_;
    local_2f8._0_8_ = scriptSig.super_CScriptBase._union.indirect_contents.indirect;
    local_2f8._8_8_ = scriptSig.super_CScriptBase._union._8_8_;
    local_2b0 = 5;
    GetScriptForDestination(&scriptPubKey,(CTxDestination *)&local_2f8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_2f8._M_first);
    ScriptHash::ScriptHash((ScriptHash *)&scriptSig_1,&scriptPubKey);
    local_2f8._16_4_ = scriptSig_1.super_CScriptBase._union._16_4_;
    local_2f8._0_8_ = scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
    local_2f8._8_8_ = scriptSig_1.super_CScriptBase._union._8_8_;
    local_2b0 = 3;
    GetScriptForDestination(&scriptSig,(CTxDestination *)&local_2f8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_2f8._M_first);
    local_2f8._16_8_ = 0;
    local_2f8._24_8_ = 0;
    local_2f8._0_8_ = 0;
    local_2f8._8_8_ = 0;
    ToByteVector<CScript>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1,&scriptPubKey);
    b_04._M_extent._M_extent_value =
         scriptSig_1.super_CScriptBase._union._8_8_ - scriptSig_1.super_CScriptBase._union._0_8_;
    b_04._M_ptr = (pointer)scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
    ppVar4 = &CScript::operator<<((CScript *)&local_2f8._M_first,b_04)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&scriptPubKey.super_CScriptBase,ppVar4);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
    scriptSig_1.super_CScriptBase._union._16_8_ = 0;
    scriptSig_1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    scriptSig_1.super_CScriptBase._union._8_8_ = 0;
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&scriptSig_1,(int *)&local_2f8);
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&scriptSig_1,(int *)&local_2f8);
    BuildTxs(&spendingTx,&coins,&creationTx,&scriptSig,&scriptPubKey,(CScriptWitness *)&scriptSig_1)
    ;
    CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
    iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
    if (iVar5 != 1) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xc2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
    CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&creationTx);
    SVar2 = VerifyWithFlag((CTransaction *)&local_2f8._M_first,&spendingTx,flags_02);
    if (SVar2 != SCRIPT_ERR_EQUALVERIFY) {
      __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xc3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&scriptSig_1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
    local_2f8._16_8_ = 0;
    local_2f8._24_8_ = 0;
    local_2f8._0_8_ = 0;
    local_2f8._8_8_ = 0;
    pCVar3 = CScript::push_int64((CScript *)&local_2f8._M_first,1);
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig,&pubkey);
    b_05._M_extent._M_extent_value =
         scriptSig.super_CScriptBase._union._8_8_ - scriptSig.super_CScriptBase._union._0_8_;
    b_05._M_ptr = (pointer)scriptSig.super_CScriptBase._union.indirect_contents.indirect;
    pCVar3 = CScript::operator<<(pCVar3,b_05);
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1,&pubkey);
    b_06._M_extent._M_extent_value =
         scriptSig_1.super_CScriptBase._union._8_8_ - scriptSig_1.super_CScriptBase._union._0_8_;
    b_06._M_ptr = (pointer)scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
    pCVar3 = CScript::operator<<(pCVar3,b_06);
    pCVar3 = CScript::push_int64(pCVar3,2);
    ppVar4 = &CScript::operator<<(pCVar3,OP_CHECKMULTISIGVERIFY)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              (&scriptPubKey.super_CScriptBase,ppVar4);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
    WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&scriptSig_1,&scriptPubKey);
    local_2f8._16_8_ = scriptSig_1.super_CScriptBase._union._16_8_;
    local_2f8._24_8_ = scriptSig_1.super_CScriptBase._24_8_;
    local_2f8._0_8_ = scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
    local_2f8._8_8_ = scriptSig_1.super_CScriptBase._union._8_8_;
    local_2b0 = 4;
    GetScriptForDestination(&scriptSig,(CTxDestination *)&local_2f8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_2f8._M_first);
    scriptSig_1.super_CScriptBase._union._16_8_ = 0;
    scriptSig_1.super_CScriptBase._24_8_ = 0;
    scriptSig_1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    scriptSig_1.super_CScriptBase._union._8_8_ = 0;
    scriptWitness_2.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scriptWitness_2.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scriptWitness_2.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>(&scriptWitness_2.stack,(int *)&local_2f8);
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>(&scriptWitness_2.stack,(int *)&local_2f8);
    local_2f8._0_8_ = &scriptPubKey;
    if (0x1c < scriptPubKey.super_CScriptBase._size) {
      local_2f8._0_8_ = scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    }
    sVar7 = scriptPubKey.super_CScriptBase._size - 0x1d;
    if (0x1c >= scriptPubKey.super_CScriptBase._size) {
      sVar7 = scriptPubKey.super_CScriptBase._size;
    }
    scriptWitness_3.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&(((CScript *)local_2f8._0_8_)->super_CScriptBase)._union +
                  (long)(int)sVar7);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)&scriptWitness_2,(iterator *)&local_2f8._M_first,(iterator *)&scriptWitness_3);
    BuildTxs(&spendingTx,&coins,&creationTx,&scriptSig,&scriptSig_1,&scriptWitness_2);
    CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
    iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
    if (iVar5 != 2) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xd1,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
    CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
    iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,1);
    if (iVar5 != 0) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xd2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
    CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&creationTx);
    SVar2 = VerifyWithFlag((CTransaction *)&local_2f8._M_first,&spendingTx,flags_03);
    if (SVar2 == SCRIPT_ERR_CHECKMULTISIGVERIFY) {
      CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&scriptWitness_2.stack);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig_1.super_CScriptBase);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
      local_2f8._16_8_ = 0;
      local_2f8._24_8_ = 0;
      local_2f8._0_8_ = 0;
      local_2f8._8_8_ = 0;
      pCVar3 = CScript::push_int64((CScript *)&local_2f8._M_first,1);
      ToByteVector<CPubKey>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig,&pubkey);
      b_07._M_extent._M_extent_value =
           scriptSig.super_CScriptBase._union._8_8_ - scriptSig.super_CScriptBase._union._0_8_;
      b_07._M_ptr = (pointer)scriptSig.super_CScriptBase._union.indirect_contents.indirect;
      pCVar3 = CScript::operator<<(pCVar3,b_07);
      ToByteVector<CPubKey>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1,&pubkey);
      b_08._M_extent._M_extent_value =
           scriptSig_1.super_CScriptBase._union._8_8_ - scriptSig_1.super_CScriptBase._union._0_8_;
      b_08._M_ptr = (pointer)scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
      pCVar3 = CScript::operator<<(pCVar3,b_08);
      pCVar3 = CScript::push_int64(pCVar3,2);
      ppVar4 = &CScript::operator<<(pCVar3,OP_CHECKMULTISIGVERIFY)->super_CScriptBase;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&scriptPubKey.super_CScriptBase,ppVar4);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig_1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
      WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&scriptSig_1,&scriptPubKey);
      local_2f8._16_8_ = scriptSig_1.super_CScriptBase._union._16_8_;
      local_2f8._24_8_ = scriptSig_1.super_CScriptBase._24_8_;
      local_2f8._0_8_ = scriptSig_1.super_CScriptBase._union.indirect_contents.indirect;
      local_2f8._8_8_ = scriptSig_1.super_CScriptBase._union._8_8_;
      local_2b0 = 4;
      GetScriptForDestination(&scriptSig,(CTxDestination *)&local_2f8._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_2f8._M_first);
      ScriptHash::ScriptHash((ScriptHash *)&scriptWitness_2,&scriptSig);
      local_2f8._16_4_ =
           scriptWitness_2.stack.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
      local_2f8._0_8_ =
           scriptWitness_2.stack.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2f8._8_8_ =
           scriptWitness_2.stack.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_2b0 = 3;
      GetScriptForDestination(&scriptSig_1,(CTxDestination *)&local_2f8._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_2f8._M_first);
      local_2f8._16_8_ = 0;
      local_2f8._24_8_ = 0;
      local_2f8._0_8_ = 0;
      local_2f8._8_8_ = 0;
      ToByteVector<CScript>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptWitness_3,
                 &scriptSig);
      b_09._M_extent._M_extent_value =
           (long)scriptWitness_3.stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)scriptWitness_3.stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      b_09._M_ptr = (pointer)scriptWitness_3.stack.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = &CScript::operator<<((CScript *)&local_2f8._M_first,b_09)->super_CScriptBase;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&scriptWitness_2,ppVar4);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptWitness_3);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f8._M_first);
      scriptWitness_3.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      scriptWitness_3.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      scriptWitness_3.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::emplace_back<int>(&scriptWitness_3.stack,(int *)&local_2f8);
      local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::emplace_back<int>(&scriptWitness_3.stack,(int *)&local_2f8);
      local_2f8._0_8_ = &scriptPubKey;
      if (0x1c < scriptPubKey.super_CScriptBase._size) {
        local_2f8._0_8_ = scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
      }
      sVar7 = scriptPubKey.super_CScriptBase._size - 0x1d;
      if (0x1c >= scriptPubKey.super_CScriptBase._size) {
        sVar7 = scriptPubKey.super_CScriptBase._size;
      }
      local_3e0.ptr =
           (uchar *)((long)&(((CScript *)local_2f8._0_8_)->super_CScriptBase)._union +
                    (long)(int)sVar7);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&scriptWitness_3,(iterator *)&local_2f8._M_first,&local_3e0);
      BuildTxs(&spendingTx,&coins,&creationTx,&scriptSig_1,(CScript *)&scriptWitness_2,
               &scriptWitness_3);
      CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&spendingTx);
      iVar5 = GetTransactionSigOpCost((CTransaction *)&local_2f8._M_first,&coins,0x801);
      if (iVar5 != 2) {
        __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                      ,0xe2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
      }
      CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
      CTransaction::CTransaction((CTransaction *)&local_2f8._M_first,&creationTx);
      SVar2 = VerifyWithFlag((CTransaction *)&local_2f8._M_first,&spendingTx,flags_04);
      if (SVar2 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
        __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                      ,0xe3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
      }
      CTransaction::~CTransaction((CTransaction *)&local_2f8._M_first);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&scriptWitness_3.stack);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&scriptWitness_2);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig_1.super_CScriptBase);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(&key.keydata);
      CCoinsViewCache::~CCoinsViewCache(&coins);
      CMutableTransaction::~CMutableTransaction(&spendingTx);
      CMutableTransaction::~CMutableTransaction(&creationTx);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xd3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                ,0xa9,"void sigopcount_tests::GetTxSigOpCost::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(GetTxSigOpCost)
{
    // Transaction creates outputs
    CMutableTransaction creationTx;
    // Transaction that spends outputs and whose
    // sig op cost is going to be tested
    CMutableTransaction spendingTx;

    // Create utxo set
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    // Create key
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();
    // Default flags
    const uint32_t flags{SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH};

    // Multisig script (legacy counting)
    {
        CScript scriptPubKey = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        // Do not use a valid signature to avoid using wallet operations.
        CScript scriptSig = CScript() << OP_0 << OP_0;

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, CScriptWitness());
        // Legacy counting only includes signature operations in scriptSigs and scriptPubKeys
        // of a transaction and does not take the actual executed sig operations into account.
        // spendingTx in itself does not contain a signature operation.
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
        // creationTx contains two signature operations in its scriptPubKey, but legacy counting
        // is not accurate.
        assert(GetTransactionSigOpCost(CTransaction(creationTx), coins, flags) == MAX_PUBKEYS_PER_MULTISIG * WITNESS_SCALE_FACTOR);
        // Sanity check: script verification fails because of an invalid signature.
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // Multisig nested in P2SH
    {
        CScript redeemScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(redeemScript));
        CScript scriptSig = CScript() << OP_0 << OP_0 << ToByteVector(redeemScript);

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, CScriptWitness());
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2 * WITNESS_SCALE_FACTOR);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // P2WPKH witness program
    {
        CScript scriptPubKey = GetScriptForDestination(WitnessV0KeyHash(pubkey));
        CScript scriptSig = CScript();
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);


        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1);
        // No signature operations if we don't verify the witness.
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY);

        // The sig op cost for witness version != 0 is zero.
        assert(scriptPubKey[0] == 0x00);
        scriptPubKey[0] = 0x51;
        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
        scriptPubKey[0] = 0x00;
        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);

        // The witness of a coinbase transaction is not taken into account.
        spendingTx.vin[0].prevout.SetNull();
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
    }

    // P2WPKH nested in P2SH
    {
        CScript scriptSig = GetScriptForDestination(WitnessV0KeyHash(pubkey));
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(scriptSig));
        scriptSig = CScript() << ToByteVector(scriptSig);
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY);
    }

    // P2WSH witness program
    {
        CScript witnessScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript scriptPubKey = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
        CScript scriptSig = CScript();
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(witnessScript.begin(), witnessScript.end());

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // P2WSH nested in P2SH
    {
        CScript witnessScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript redeemScript = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(redeemScript));
        CScript scriptSig = CScript() << ToByteVector(redeemScript);
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(witnessScript.begin(), witnessScript.end());

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }
}